

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_decomp_img(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  bool bVar2;
  undefined8 local_110;
  double dnulval;
  undefined8 *puStack_100;
  float fnulval;
  float *nulladdr;
  long memsize;
  long imgsize;
  long inc [6];
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  int local_4c;
  uint local_48;
  int anynul;
  int nullcheck;
  int byte_per_pix;
  int datatype;
  int ii;
  double *data;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  nullcheck = 0;
  anynul = 0;
  if (*status < 1) {
    data = (double *)status;
    status_local = &outfptr->HDUposition;
    outfptr_local = infptr;
    iVar1 = fits_is_compressed_image(infptr,status);
    if (iVar1 == 0) {
      ffpmsg("CHDU is not a compressed image (fits_decompress_img)");
      *(undefined4 *)data = 0x19e;
      infptr_local._4_4_ = 0x19e;
    }
    else {
      iVar1 = ffcrim((fitsfile *)status_local,outfptr_local->Fptr->zbitpix,
                     outfptr_local->Fptr->zndim,outfptr_local->Fptr->znaxis,(int *)data);
      if (iVar1 < 1) {
        iVar1 = imcomp_copy_imheader(outfptr_local,(fitsfile *)status_local,(int *)data);
        if (iVar1 < 1) {
          ffrdef((fitsfile *)status_local,(int *)data);
          ffpscl((fitsfile *)status_local,1.0,0.0,(int *)data);
          ffpscl(outfptr_local,1.0,0.0,(int *)data);
          local_48 = 0;
          puStack_100 = (undefined8 *)((long)&dnulval + 4);
          if (outfptr_local->Fptr->zbitpix == 8) {
            nullcheck = 0xb;
            anynul = 1;
          }
          else if (outfptr_local->Fptr->zbitpix == 0x10) {
            nullcheck = 0x15;
            anynul = 2;
          }
          else if (outfptr_local->Fptr->zbitpix == 0x20) {
            nullcheck = 0x1f;
            anynul = 4;
          }
          else if (outfptr_local->Fptr->zbitpix == -0x20) {
            local_48 = 1;
            dnulval._4_4_ = 0x8541f136;
            puStack_100 = (undefined8 *)((long)&dnulval + 4);
            nullcheck = 0x2a;
            anynul = 4;
          }
          else {
            bVar2 = outfptr_local->Fptr->zbitpix == -0x40;
            if (bVar2) {
              local_110 = 0xb8a83e285ebab4b7;
              puStack_100 = &local_110;
              nullcheck = 0x52;
              anynul = 8;
            }
            local_48 = (uint)bVar2;
          }
          memsize = 1;
          for (byte_per_pix = 0; byte_per_pix < outfptr_local->Fptr->zndim;
              byte_per_pix = byte_per_pix + 1) {
            memsize = outfptr_local->Fptr->znaxis[byte_per_pix] * memsize;
            lpixel[(long)byte_per_pix + 5] = 1;
            inc[(long)byte_per_pix + 5] = outfptr_local->Fptr->znaxis[byte_per_pix];
            inc[(long)byte_per_pix + -1] = 1;
          }
          nulladdr = (float *)((memsize * anynul - 1U >> 3) + 1);
          _datatype = calloc((size_t)nulladdr,8);
          if (_datatype == (void *)0x0) {
            ffpmsg("Couldn\'t allocate memory for the uncompressed image");
            *(undefined4 *)data = 0x71;
            infptr_local._4_4_ = 0x71;
          }
          else {
            fits_read_compressed_img
                      (outfptr_local,nullcheck,lpixel + 5,inc + 5,&imgsize,local_48,puStack_100,
                       _datatype,(char *)0x0,&local_4c,(int *)data);
            if (local_4c == 0) {
              ffppr((fitsfile *)status_local,nullcheck,1,memsize,_datatype,(int *)data);
            }
            else {
              ffppn((fitsfile *)status_local,nullcheck,1,memsize,_datatype,puStack_100,(int *)data);
            }
            free(_datatype);
            infptr_local._4_4_ = *(int *)data;
          }
        }
        else {
          ffpmsg("error copying header of compressed image");
          infptr_local._4_4_ = *(int *)data;
        }
      }
      else {
        ffpmsg("error creating output decompressed image HDU");
        infptr_local._4_4_ = *(int *)data;
      }
    }
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int fits_decompress_img (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  THIS IS AN OBSOLETE ROUTINE.  USE fits_img_decompress instead!!!
  
  This routine decompresses the whole image and writes it to the output file.
*/

{
    double *data;
    int ii, datatype = 0, byte_per_pix = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize, memsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (*status > 0)
        return(*status);

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_decompress_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* create an empty output image with the correct dimensions */
    if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
       (infptr->Fptr)->znaxis, status) > 0)
    {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }
    /* Copy the table header to the image header. */
    if (imcomp_copy_imheader(infptr, outfptr, status) > 0)
    {
        ffpmsg("error copying header of compressed image");
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
        byte_per_pix = 1;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        byte_per_pix = sizeof(short);
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        byte_per_pix = sizeof(int);
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
        byte_per_pix = sizeof(float);
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
        byte_per_pix = sizeof(double);
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }
    /* Calc equivalent number of double pixels same size as whole the image. */
    /* We use double datatype to force the memory to be aligned properly */
    memsize = ((imgsize * byte_per_pix) - 1) / sizeof(double) + 1;

    /* allocate memory for the image */
    data = (double*) calloc (memsize, sizeof(double));
    if (!data)
    { 
        ffpmsg("Couldn't allocate memory for the uncompressed image");
        return(*status = MEMORY_ALLOCATION);
    }

    /* uncompress the entire image into memory */
    /* This routine should be enhanced sometime to only need enough */
    /* memory to uncompress one tile at a time.  */
    fits_read_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, data, NULL, &anynul, status);

    /* write the image to the output file */
    if (anynul)
        fits_write_imgnull(outfptr, datatype, 1, imgsize, data, nulladdr, 
                          status);
    else
        fits_write_img(outfptr, datatype, 1, imgsize, data, status);

    free(data);
    return (*status);
}